

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bind_buffer_base(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_20;
  GLuint local_1c;
  int maxTFSize;
  int maxUSize;
  deUint32 bufTF;
  deUint32 bufU;
  NegativeTestContext *ctx_local;
  
  maxUSize = 0x1234;
  maxTFSize = 0x1234;
  local_1c = 0x1234;
  local_20 = 0x1234;
  _bufTF = ctx;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&maxUSize);
  glu::CallLogWrapper::glBindBuffer(&_bufTF->super_CallLogWrapper,0x8a11,maxUSize);
  glu::CallLogWrapper::glBufferData(&_bufTF->super_CallLogWrapper,0x8a11,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&_bufTF->super_CallLogWrapper,1,(GLuint *)&maxTFSize);
  glu::CallLogWrapper::glBindBuffer(&_bufTF->super_CallLogWrapper,0x8c8e,maxTFSize);
  glu::CallLogWrapper::glBufferData(&_bufTF->super_CallLogWrapper,0x8c8e,0x10,(void *)0x0,0x88e0);
  NegativeTestContext::expectError(_bufTF,0);
  pNVar1 = _bufTF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER."
             ,&local_41);
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glBindBufferBase(&_bufTF->super_CallLogWrapper,0xffffffff,0,maxUSize);
  NegativeTestContext::expectError(_bufTF,0x500);
  glu::CallLogWrapper::glBindBufferBase(&_bufTF->super_CallLogWrapper,0x8892,0,maxUSize);
  NegativeTestContext::expectError(_bufTF,0x500);
  NegativeTestContext::endSection(_bufTF);
  pNVar1 = _bufTF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS."
             ,&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetIntegerv(&_bufTF->super_CallLogWrapper,0x8a2f,(GLint *)&local_1c);
  glu::CallLogWrapper::glBindBufferBase(&_bufTF->super_CallLogWrapper,0x8a11,local_1c,maxUSize);
  NegativeTestContext::expectError(_bufTF,0x501);
  NegativeTestContext::endSection(_bufTF);
  pNVar1 = _bufTF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER andindex is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS."
             ,&local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glGetIntegerv(&_bufTF->super_CallLogWrapper,0x8c8b,(GLint *)&local_20);
  glu::CallLogWrapper::glBindBufferBase(&_bufTF->super_CallLogWrapper,0x8c8e,local_20,maxTFSize);
  NegativeTestContext::expectError(_bufTF,0x501);
  NegativeTestContext::endSection(_bufTF);
  glu::CallLogWrapper::glDeleteBuffers(&_bufTF->super_CallLogWrapper,1,(GLuint *)&maxUSize);
  glu::CallLogWrapper::glDeleteBuffers(&_bufTF->super_CallLogWrapper,1,(GLuint *)&maxTFSize);
  return;
}

Assistant:

void bind_buffer_base (NegativeTestContext& ctx)
{
	deUint32	bufU		= 0x1234;
	deUint32	bufTF		= 0x1234;
	int			maxUSize	= 0x1234;
	int			maxTFSize	= 0x1234;

	ctx.glGenBuffers(1, &bufU);
	ctx.glBindBuffer(GL_UNIFORM_BUFFER, bufU);
	ctx.glBufferData(GL_UNIFORM_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufTF);
	ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bufTF);
	ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STREAM_DRAW);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER.");
	ctx.glBindBufferBase(-1, 0, bufU);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindBufferBase(GL_ARRAY_BUFFER, 0, bufU);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUSize);
	ctx.glBindBufferBase(GL_UNIFORM_BUFFER, maxUSize, bufU);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER andindex is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &maxTFSize);
	ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, maxTFSize, bufTF);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &bufU);
	ctx.glDeleteBuffers(1, &bufTF);
}